

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructuresOperators.cpp
# Opt level: O2

ostream * operator<<(ostream *outs,RGB rgb)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<(outs,(uint3)rgb & 0xff);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rgb._1_2_ & 0xff);
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::operator<<(poVar1,(uint)((uint3)rgb >> 0x10));
  return outs;
}

Assistant:

std::ostream& operator<<(std::ostream& outs, RGB rgb)
{
  outs << static_cast<int>(rgb.r) << " " << static_cast<int>(rgb.g) << " "
       << static_cast<int>(rgb.b);
  return outs;
}